

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXExportProperty.cpp
# Opt level: O0

void __thiscall
Assimp::FBX::FBXExportProperty::DumpBinary(FBXExportProperty *this,StreamWriterLE *s)

{
  double *pdVar1;
  reference pvVar2;
  size_type sVar3;
  size_type sVar4;
  ostream *poVar5;
  DeadlyImportError *this_00;
  string local_1f8;
  ostringstream local_1c8 [8];
  ostringstream err;
  ulong local_50;
  size_t i_4;
  size_t i_3;
  size_t i_2;
  size_t i_1;
  size_t i;
  size_t N;
  uint8_t *d;
  StreamWriterLE *s_local;
  FBXExportProperty *this_local;
  
  StreamWriter<false,_false>::PutU1(s,this->type);
  pdVar1 = (double *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(&this->data);
  switch(this->type) {
  case 'C':
    StreamWriter<false,_false>::PutU1(s,*(uint8_t *)pdVar1);
    break;
  case 'D':
    StreamWriter<false,_false>::PutF8(s,*pdVar1);
    break;
  default:
    std::__cxx11::ostringstream::ostringstream(local_1c8);
    std::operator<<((ostream *)local_1c8,"Tried to dump property with invalid type \'");
    poVar5 = std::operator<<((ostream *)local_1c8,this->type);
    std::operator<<(poVar5,"\'!");
    this_00 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    DeadlyImportError::DeadlyImportError(this_00,&local_1f8);
    __cxa_throw(this_00,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
  case 'F':
    StreamWriter<false,_false>::PutF4(s,*(float *)pdVar1);
    break;
  case 'I':
    StreamWriter<false,_false>::PutI4(s,(int32_t)*(float *)pdVar1);
    break;
  case 'L':
    StreamWriter<false,_false>::PutI8(s,(int64_t)*pdVar1);
    break;
  case 'R':
  case 'S':
    sVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&this->data);
    StreamWriter<false,_false>::PutU4(s,(uint32_t)sVar3);
    for (i_1 = 0; sVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                                    (&this->data), i_1 < sVar3; i_1 = i_1 + 1) {
      pvVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         (&this->data,i_1);
      StreamWriter<false,_false>::PutU1(s,*pvVar2);
    }
    break;
  case 'Y':
    StreamWriter<false,_false>::PutI2(s,*(int16_t *)pdVar1);
    break;
  case 'd':
    sVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&this->data);
    StreamWriter<false,_false>::PutU4(s,(uint32_t)(sVar3 >> 3));
    StreamWriter<false,_false>::PutU4(s,0);
    sVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&this->data);
    StreamWriter<false,_false>::PutU4(s,(uint32_t)sVar4);
    for (local_50 = 0; local_50 < sVar3 >> 3; local_50 = local_50 + 1) {
      StreamWriter<false,_false>::PutF8(s,pdVar1[local_50]);
    }
    break;
  case 'f':
    sVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&this->data);
    StreamWriter<false,_false>::PutU4(s,(uint32_t)(sVar3 >> 2));
    StreamWriter<false,_false>::PutU4(s,0);
    sVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&this->data);
    StreamWriter<false,_false>::PutU4(s,(uint32_t)sVar4);
    for (i_4 = 0; i_4 < sVar3 >> 2; i_4 = i_4 + 1) {
      StreamWriter<false,_false>::PutF4(s,*(float *)((long)pdVar1 + i_4 * 4));
    }
    break;
  case 'i':
    sVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&this->data);
    StreamWriter<false,_false>::PutU4(s,(uint32_t)(sVar3 >> 2));
    StreamWriter<false,_false>::PutU4(s,0);
    sVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&this->data);
    StreamWriter<false,_false>::PutU4(s,(uint32_t)sVar4);
    for (i_2 = 0; i_2 < sVar3 >> 2; i_2 = i_2 + 1) {
      StreamWriter<false,_false>::PutI4(s,(int32_t)*(float *)((long)pdVar1 + i_2 * 4));
    }
    break;
  case 'l':
    sVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&this->data);
    StreamWriter<false,_false>::PutU4(s,(uint32_t)(sVar3 >> 3));
    StreamWriter<false,_false>::PutU4(s,0);
    sVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&this->data);
    StreamWriter<false,_false>::PutU4(s,(uint32_t)sVar4);
    for (i_3 = 0; i_3 < sVar3 >> 3; i_3 = i_3 + 1) {
      StreamWriter<false,_false>::PutI8(s,(int64_t)pdVar1[i_3]);
    }
  }
  return;
}

Assistant:

void FBXExportProperty::DumpBinary(Assimp::StreamWriterLE& s) {
    s.PutU1(type);
    uint8_t* d = data.data();
    size_t N;
    switch (type) {
        case 'C': s.PutU1(*(reinterpret_cast<uint8_t*>(d))); return;
        case 'Y': s.PutI2(*(reinterpret_cast<int16_t*>(d))); return;
        case 'I': s.PutI4(*(reinterpret_cast<int32_t*>(d))); return;
        case 'F': s.PutF4(*(reinterpret_cast<float*>(d))); return;
        case 'D': s.PutF8(*(reinterpret_cast<double*>(d))); return;
        case 'L': s.PutI8(*(reinterpret_cast<int64_t*>(d))); return;
        case 'S':
        case 'R':
            s.PutU4(uint32_t(data.size()));
            for (size_t i = 0; i < data.size(); ++i) { s.PutU1(data[i]); }
            return;
        case 'i':
            N = data.size() / 4;
            s.PutU4(uint32_t(N)); // number of elements
            s.PutU4(0); // no encoding (1 would be zip-compressed)
            // TODO: compress if large?
            s.PutU4(uint32_t(data.size())); // data size
            for (size_t i = 0; i < N; ++i) {
                s.PutI4((reinterpret_cast<int32_t*>(d))[i]);
            }
            return;
        case 'l':
            N = data.size() / 8;
            s.PutU4(uint32_t(N)); // number of elements
            s.PutU4(0); // no encoding (1 would be zip-compressed)
            // TODO: compress if large?
            s.PutU4(uint32_t(data.size())); // data size
            for (size_t i = 0; i < N; ++i) {
                s.PutI8((reinterpret_cast<int64_t*>(d))[i]);
            }
            return;
        case 'f':
            N = data.size() / 4;
            s.PutU4(uint32_t(N)); // number of elements
            s.PutU4(0); // no encoding (1 would be zip-compressed)
            // TODO: compress if large?
            s.PutU4(uint32_t(data.size())); // data size
            for (size_t i = 0; i < N; ++i) {
                s.PutF4((reinterpret_cast<float*>(d))[i]);
            }
            return;
        case 'd':
            N = data.size() / 8;
            s.PutU4(uint32_t(N)); // number of elements
            s.PutU4(0); // no encoding (1 would be zip-compressed)
            // TODO: compress if large?
            s.PutU4(uint32_t(data.size())); // data size
            for (size_t i = 0; i < N; ++i) {
                s.PutF8((reinterpret_cast<double*>(d))[i]);
            }
            return;
        default:
            std::ostringstream err;
            err << "Tried to dump property with invalid type '";
            err << type << "'!";
            throw DeadlyExportError(err.str());
    }
}